

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

void __thiscall
TEST_MockReturnValueTest_WhenADoubleReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
::testBody(TEST_MockReturnValueTest_WhenADoubleReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
           *this)

{
  undefined8 uVar1;
  int iVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  undefined4 extraout_var_00;
  TestTerminator *pTVar5;
  undefined8 uVar6;
  undefined8 extraout_XMM0_Qa;
  SimpleString local_80;
  SimpleString local_70;
  SimpleString local_60;
  SimpleString local_50 [2];
  SimpleString local_30;
  undefined8 local_20;
  double expected_return_value;
  double default_return_value;
  TEST_MockReturnValueTest_WhenADoubleReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault_Test
  *this_local;
  
  expected_return_value = 10.7;
  local_20 = 0x4028000000000000;
  default_return_value = (double)this;
  SimpleString::SimpleString(&local_30,"");
  pMVar3 = mock(&local_30,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_50,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_50);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xf8))(local_20);
  SimpleString::~SimpleString(local_50);
  SimpleString::~SimpleString(&local_30);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_20;
  SimpleString::SimpleString(&local_60,"");
  pMVar3 = mock(&local_60,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_70,"foo");
  iVar2 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_70);
  uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x138))(expected_return_value);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x15])
            (uVar1,uVar6,0x3fa999999999999a,pUVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xe0,pTVar5);
  SimpleString::~SimpleString(&local_70);
  SimpleString::~SimpleString(&local_60);
  pUVar4 = UtestShell::getCurrent();
  uVar1 = local_20;
  SimpleString::SimpleString(&local_80,"");
  pMVar3 = mock(&local_80,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x19])(expected_return_value);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0x15])
            (uVar1,extraout_XMM0_Qa,0x3fa999999999999a,pUVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0xe1,pTVar5);
  SimpleString::~SimpleString(&local_80);
  return;
}

Assistant:

TEST(MockReturnValueTest, WhenADoubleReturnValueIsExpectedAndAlsoThereIsADefaultShouldlIgnoreTheDefault)
{
    double default_return_value = 10.7;
    double expected_return_value = default_return_value + 1.3;
    mock().expectOneCall("foo").andReturnValue(expected_return_value);

    DOUBLES_EQUAL(expected_return_value, mock().actualCall("foo").returnDoubleValueOrDefault(default_return_value), 0.05);
    DOUBLES_EQUAL(expected_return_value, mock().returnDoubleValueOrDefault(default_return_value), 0.05);
}